

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O1

void on_link_state_changed(void *context,LINK_STATE new_link_state,LINK_STATE previous_link_state)

{
  MESSAGE_RECEIVER_INSTANCE *message_receiver;
  
  if (new_link_state == LINK_STATE_DETACHED) {
    if (*(int *)((long)context + 0x18) - 3U < 2) {
      *(undefined4 *)((long)context + 0x18) = 1;
      if (*(code **)((long)context + 0x10) != (code *)0x0) {
        (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),1);
        return;
      }
    }
    else if (*(int *)((long)context + 0x18) != 1) {
      *(undefined4 *)((long)context + 0x18) = 5;
      if (*(code **)((long)context + 0x10) != (code *)0x0) {
        (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),5);
        return;
      }
    }
  }
  else if (new_link_state == LINK_STATE_ERROR) {
    if (*(int *)((long)context + 0x18) != 5) {
      *(undefined4 *)((long)context + 0x18) = 5;
      if (*(code **)((long)context + 0x10) != (code *)0x0) {
        (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),5);
        return;
      }
    }
  }
  else if ((new_link_state == LINK_STATE_ATTACHED) && (*(int *)((long)context + 0x18) == 2)) {
    *(undefined4 *)((long)context + 0x18) = 3;
    if (*(code **)((long)context + 0x10) != (code *)0x0) {
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),3);
      return;
    }
  }
  return;
}

Assistant:

static void on_link_state_changed(void* context, LINK_STATE new_link_state, LINK_STATE previous_link_state)
{
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;
    (void)previous_link_state;

    switch (new_link_state)
    {
    default:
        break;

    case LINK_STATE_ATTACHED:
        if (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPENING)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_OPEN);
        }
        break;
    case LINK_STATE_DETACHED:
        if ((message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN) ||
            (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_CLOSING))
        {
            /* User initiated transition, we should be good */
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_IDLE);
        }
        else if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_IDLE)
        {
            /* Any other transition must be an error */
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        break;
    case LINK_STATE_ERROR:
        if (message_receiver->message_receiver_state != MESSAGE_RECEIVER_STATE_ERROR)
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        break;
    }
}